

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O1

LogicalType * __thiscall
duckdb::Binder::BindLogicalTypeInternal
          (LogicalType *__return_storage_ptr__,Binder *this,LogicalType *type,
          optional_ptr<duckdb::Catalog,_true> catalog,string *schema)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pLVar2;
  element_type *peVar3;
  optional_ptr<duckdb::Catalog,_true> catalog_00;
  undefined8 uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  __node_base this_01;
  size_type sVar6;
  bool bVar7;
  string *psVar8;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *__x;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *__x_00;
  LogicalType *pLVar9;
  idx_t iVar10;
  vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *this_02;
  BinderException *this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  code *pcVar11;
  ulong index;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this_04;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  string type_catalog;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  EntryLookupInfo type_lookup;
  string user_type_name;
  string user_type_schema;
  string type_schema;
  vector<duckdb::Value,_true> user_type_mods;
  optional_ptr<duckdb::Catalog,_true> local_1c8;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  _Alloc_hider _Stack_190;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_188;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_158;
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  __node_base local_120;
  string local_118;
  optional_idx local_f8;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_f0;
  __uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_> local_e8;
  child_list_t<LogicalType> local_d8;
  child_list_t<LogicalType> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [32];
  LogicalType local_60;
  LogicalType local_48;
  
  local_1c8.ptr = catalog.ptr;
  _local_178 = schema;
  if (type->id_ == USER) {
    psVar8 = UserType::GetTypeName_abi_cxx11_(type);
    local_168._M_allocated_capacity = (size_type)&aStack_158;
    pcVar1 = (psVar8->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,pcVar1,pcVar1 + psVar8->_M_string_length);
    psVar8 = UserType::GetSchema_abi_cxx11_(type);
    local_148._0_8_ = &local_138;
    pcVar1 = (psVar8->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_148,pcVar1,pcVar1 + psVar8->_M_string_length);
    __x = &UserType::GetTypeModifiers(type)->
           super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>;
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f0,__x);
    LogicalType::LogicalType(__return_storage_ptr__);
    EntryLookupInfo::EntryLookupInfo
              ((EntryLookupInfo *)&local_198,TYPE_ENTRY,(string *)&local_168,
               (QueryErrorContext)0xffffffffffffffff);
    if (local_1c8.ptr == (Catalog *)0x0) {
      psVar8 = UserType::GetCatalog_abi_cxx11_(type);
      pcVar1 = (psVar8->_M_dataplus)._M_p;
      local_1c0._0_8_ = (ClientContext *)auStack_1b0;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1c0,pcVar1,pcVar1 + psVar8->_M_string_length);
      psVar8 = UserType::GetSchema_abi_cxx11_(type);
      pcVar1 = (psVar8->_M_dataplus)._M_p;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,pcVar1,pcVar1 + psVar8->_M_string_length);
      BindSchemaOrCatalog(this->context,(string *)local_1c0,&local_118);
      auStack_1b0._16_8_ =
           CatalogEntryRetriever::GetEntry
                     (&this->entry_retriever,(string *)local_1c0,&local_118,
                      (EntryLookupInfo *)&local_198,THROW_EXCEPTION);
      optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                ((optional_ptr<duckdb::CatalogEntry,_true> *)(auStack_1b0 + 0x10));
      uVar4 = auStack_1b0._16_8_;
      if ((LogicalType *)
          &(((DBConfig *)(auStack_1b0._16_8_ + 0x10))->options).autoinstall_extension_repo.
           _M_string_length != __return_storage_ptr__) {
        __return_storage_ptr__->id_ =
             (LogicalTypeId)
             (((DBConfig *)(auStack_1b0._16_8_ + 0x10))->options).autoinstall_extension_repo.
             _M_string_length;
        __return_storage_ptr__->physical_type_ =
             *(undefined1 *)
              ((long)&(((DBConfig *)(auStack_1b0._16_8_ + 0x10))->options).
                      autoinstall_extension_repo._M_string_length + 1);
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&__return_storage_ptr__->type_info_,
                   (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                   &(((DBConfig *)(auStack_1b0._16_8_ + 0x10))->options).autoinstall_extension_repo.
                    field_2);
      }
      pcVar11 = (code *)(((DBConfig *)(uVar4 + 0x10))->options).maximum_memory;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((ClientContext *)local_1c0._0_8_ != (ClientContext *)auStack_1b0) {
        operator_delete((void *)local_1c0._0_8_);
      }
    }
    else {
      auStack_1b0._16_8_ = (element_type *)0x0;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        optional_ptr<duckdb::Catalog,_true>::CheckValid(&local_1c8);
        auStack_1b0._16_8_ =
             CatalogEntryRetriever::GetEntry
                       (&this->entry_retriever,local_1c8.ptr,(string *)local_148,
                        (EntryLookupInfo *)&local_198,RETURN_NULL);
      }
      local_1c0._0_8_ = auStack_1b0._16_8_;
      if (((element_type *)auStack_1b0._16_8_ == (element_type *)0x0) ||
         (optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                    ((optional_ptr<duckdb::CatalogEntry,_true> *)local_1c0),
         (char)(((atomic<unsigned_long> *)(local_1c0._0_8_ + 0x120))->
               super___atomic_base<unsigned_long>)._M_i == '\0')) {
        optional_ptr<duckdb::Catalog,_true>::CheckValid(&local_1c8);
        auStack_1b0._16_8_ =
             CatalogEntryRetriever::GetEntry
                       (&this->entry_retriever,local_1c8.ptr,(string *)_local_178,
                        (EntryLookupInfo *)&local_198,RETURN_NULL);
      }
      local_1c0._0_8_ = auStack_1b0._16_8_;
      if (((element_type *)auStack_1b0._16_8_ == (element_type *)0x0) ||
         (optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                    ((optional_ptr<duckdb::CatalogEntry,_true> *)local_1c0),
         (char)(((atomic<unsigned_long> *)(local_1c0._0_8_ + 0x120))->
               super___atomic_base<unsigned_long>)._M_i == '\0')) {
        optional_ptr<duckdb::Catalog,_true>::CheckValid(&local_1c8);
        catalog_00.ptr = local_1c8.ptr;
        local_1c0._0_8_ = (CatalogEntry *)auStack_1b0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c0,anon_var_dwarf_63b5960 + 9);
        auStack_1b0._16_8_ =
             CatalogEntryRetriever::GetEntry
                       (&this->entry_retriever,catalog_00.ptr,(string *)local_1c0,
                        (EntryLookupInfo *)&local_198,RETURN_NULL);
        if ((CatalogEntry *)local_1c0._0_8_ != (CatalogEntry *)auStack_1b0) {
          operator_delete((void *)local_1c0._0_8_);
        }
      }
      local_1c0._0_8_ = auStack_1b0._16_8_;
      if (((element_type *)auStack_1b0._16_8_ == (element_type *)0x0) ||
         (optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                    ((optional_ptr<duckdb::CatalogEntry,_true> *)local_1c0),
         (char)(((atomic<unsigned_long> *)(local_1c0._0_8_ + 0x120))->
               super___atomic_base<unsigned_long>)._M_i == '\0')) {
        local_1c0._0_8_ = (ClientContext *)auStack_1b0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c0,anon_var_dwarf_63b5960 + 9);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,anon_var_dwarf_63b5960 + 9);
        auStack_1b0._16_8_ =
             CatalogEntryRetriever::GetEntry
                       (&this->entry_retriever,(string *)local_1c0,&local_118,
                        (EntryLookupInfo *)&local_198,THROW_EXCEPTION);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        if ((ClientContext *)local_1c0._0_8_ != (ClientContext *)auStack_1b0) {
          operator_delete((void *)local_1c0._0_8_);
        }
      }
      optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                ((optional_ptr<duckdb::CatalogEntry,_true> *)(auStack_1b0 + 0x10));
      uVar4 = auStack_1b0._16_8_;
      if ((LogicalType *)
          &(((DBConfig *)(auStack_1b0._16_8_ + 0x10))->options).autoinstall_extension_repo.
           _M_string_length != __return_storage_ptr__) {
        __return_storage_ptr__->id_ =
             (LogicalTypeId)
             (((DBConfig *)(auStack_1b0._16_8_ + 0x10))->options).autoinstall_extension_repo.
             _M_string_length;
        __return_storage_ptr__->physical_type_ =
             *(undefined1 *)
              ((long)&(((DBConfig *)(auStack_1b0._16_8_ + 0x10))->options).
                      autoinstall_extension_repo._M_string_length + 1);
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&__return_storage_ptr__->type_info_,
                   (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                   &(((DBConfig *)(auStack_1b0._16_8_ + 0x10))->options).autoinstall_extension_repo.
                    field_2);
      }
      pcVar11 = (code *)(((DBConfig *)(uVar4 + 0x10))->options).maximum_memory;
    }
    BindLogicalType(this,__return_storage_ptr__,local_1c8,(string *)_local_178);
    if (pcVar11 == (code *)0x0) {
      if ((tuple<duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)
          local_f0._M_head_impl !=
          (_Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)
          local_e8._M_t.
          super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>
          .super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl) {
        this_03 = (BinderException *)__cxa_allocate_exception(0x10);
        local_1c0._0_8_ = auStack_1b0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c0,"Type \'%s\' does not take any type modifiers","");
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,local_168._M_allocated_capacity,
                   local_168._8_8_ + local_168._M_allocated_capacity);
        BinderException::BinderException<std::__cxx11::string>
                  (this_03,(string *)local_1c0,&local_a0);
        __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_1c0._0_8_ = this->context;
      local_1c0._8_8_ = __return_storage_ptr__;
      auStack_1b0._0_8_ = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f0;
      (*pcVar11)(&local_118);
      uVar4 = local_118.field_2._M_allocated_capacity;
      sVar6 = local_118._M_string_length;
      __return_storage_ptr__->id_ = (LogicalTypeId)local_118._M_dataplus._M_p;
      __return_storage_ptr__->physical_type_ = local_118._M_dataplus._M_p._1_1_;
      uVar12 = *(undefined4 *)
                &(__return_storage_ptr__->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar13 = *(undefined4 *)
                ((long)&(__return_storage_ptr__->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      peVar3 = (__return_storage_ptr__->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar14 = *(undefined4 *)
                &(__return_storage_ptr__->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar15 = *(undefined4 *)
                ((long)&(__return_storage_ptr__->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (__return_storage_ptr__->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (__return_storage_ptr__->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      this_00 = (__return_storage_ptr__->type_info_).internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (__return_storage_ptr__->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)sVar6;
      (__return_storage_ptr__->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _local_178 = peVar3;
        uStack_170 = uVar14;
        uStack_16c = uVar15;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        uVar12 = local_178;
        uVar13 = uStack_174;
        uVar14 = uStack_170;
        uVar15 = uStack_16c;
      }
      uVar4 = local_118.field_2._M_allocated_capacity;
      local_118._M_string_length = CONCAT44(uVar13,uVar12);
      local_118.field_2._M_allocated_capacity._4_4_ = uVar15;
      local_118.field_2._M_local_buf[0] = SUB41(uVar14,0);
      local_118.field_2._M_local_buf[1] = SUB41(uVar14,1);
      local_118.field_2._M_local_buf[2] = SUB41(uVar14,2);
      local_118.field_2._M_local_buf[3] = SUB41(uVar14,3);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
      }
      LogicalType::~LogicalType((LogicalType *)&local_118);
    }
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._0_8_ != &local_138) {
      operator_delete((void *)local_148._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_allocated_capacity == &aStack_158) {
      return __return_storage_ptr__;
    }
    operator_delete((void *)local_168._M_allocated_capacity);
    return __return_storage_ptr__;
  }
  LogicalType::LogicalType((LogicalType *)&local_168);
  switch(type->id_) {
  case STRUCT:
    __x_00 = &StructType::GetChildTypes_abi_cxx11_(type)->
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)local_148,__x_00);
    uVar4 = local_148._8_8_;
    local_198._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_190._M_p = (pointer)0x0;
    _Stack_188._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (local_148._0_8_ != local_148._8_8_) {
      __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148._0_8_;
      do {
        BindLogicalTypeInternal
                  ((LogicalType *)local_1c0,this,(LogicalType *)(__args + 1),local_1c8,
                   (string *)_local_178);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::__cxx11::string&,duckdb::LogicalType>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&local_198,__args,(LogicalType *)local_1c0);
        LogicalType::~LogicalType((LogicalType *)local_1c0);
        __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&__args[1].field_2 + 8);
      } while (__args != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar4)
      ;
    }
    local_b8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_198._M_pi;
    local_b8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_190._M_p;
    local_b8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_Stack_188._M_pi;
    local_198._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_190._M_p = (pointer)0x0;
    _Stack_188._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LogicalType::STRUCT((LogicalType *)local_1c0,&local_b8);
    local_168._M_allocated_capacity._0_2_ = local_1c0._0_2_;
    LogicalType::~LogicalType((LogicalType *)local_1c0);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_b8);
    this_04 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_198;
    break;
  case LIST:
    pLVar9 = ListType::GetChildType(type);
    BindLogicalTypeInternal((LogicalType *)local_148,this,pLVar9,local_1c8,(string *)_local_178);
    LogicalType::LIST((LogicalType *)&local_198,(LogicalType *)local_148);
    goto LAB_011d9623;
  case MAP:
    pLVar9 = MapType::KeyType(type);
    BindLogicalTypeInternal((LogicalType *)local_148,this,pLVar9,local_1c8,(string *)_local_178);
    pLVar9 = MapType::ValueType(type);
    BindLogicalTypeInternal((LogicalType *)&local_198,this,pLVar9,local_1c8,(string *)_local_178);
    LogicalType::LogicalType(&local_48,(LogicalType *)local_148);
    LogicalType::LogicalType(&local_60,(LogicalType *)&local_198);
    LogicalType::MAP((LogicalType *)local_1c0,&local_48,&local_60);
    local_168._M_allocated_capacity._0_2_ = local_1c0._0_2_;
    LogicalType::~LogicalType((LogicalType *)local_1c0);
    LogicalType::~LogicalType(&local_60);
    LogicalType::~LogicalType(&local_48);
    goto LAB_011d9679;
  default:
    LogicalType::LogicalType(__return_storage_ptr__,type);
    goto LAB_011d9899;
  case UNION:
    local_148._0_8_ = (__hashtable_alloc *)0x0;
    local_148._8_8_ = 0;
    local_138._M_allocated_capacity = 0;
    for (index = 0; iVar10 = UnionType::GetMemberCount(type), index < iVar10; index = index + 1) {
      pLVar9 = UnionType::GetMemberType(type,index);
      BindLogicalTypeInternal((LogicalType *)&local_198,this,pLVar9,local_1c8,(string *)_local_178);
      psVar8 = UnionType::GetMemberName_abi_cxx11_(type,index);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
      ::emplace_back<std::__cxx11::string_const&,duckdb::LogicalType>
                ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                  *)local_148,psVar8,(LogicalType *)&local_198);
      LogicalType::~LogicalType((LogicalType *)&local_198);
    }
    local_d8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_148._0_8_;
    local_d8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_148._8_8_;
    local_d8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_138._M_allocated_capacity;
    local_148._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_148._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_138._M_allocated_capacity = 0;
    LogicalType::UNION((LogicalType *)&local_198,&local_d8);
    _Var5._M_pi = local_198._M_pi;
    local_168._M_local_buf[0] = (CatalogType)local_198._M_pi;
    local_168._M_local_buf[1] = local_198._M_pi._1_1_;
    _Stack_188._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_158._M_allocated_capacity;
    _Stack_190._M_p = (pointer)local_168._8_8_;
    local_198._M_pi = _Var5._M_pi;
    LogicalType::~LogicalType((LogicalType *)&local_198);
    this_04 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_d8;
    break;
  case ARRAY:
    pLVar9 = ArrayType::GetChildType(type);
    BindLogicalTypeInternal((LogicalType *)local_148,this,pLVar9,local_1c8,(string *)_local_178);
    iVar10 = ArrayType::GetSize(type);
    optional_idx::optional_idx(&local_f8,iVar10);
    LogicalType::ARRAY((LogicalType *)&local_198,(LogicalType *)local_148,local_f8);
LAB_011d9623:
    _Var5._M_pi = local_198._M_pi;
    local_168._M_local_buf[0] = (CatalogType)local_198._M_pi;
    local_168._M_local_buf[1] = local_198._M_pi._1_1_;
    _Stack_190._M_p = (pointer)local_168._8_8_;
    _Stack_188._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_158._M_allocated_capacity;
    local_198._M_pi = _Var5._M_pi;
LAB_011d9679:
    LogicalType::~LogicalType((LogicalType *)&local_198);
    LogicalType::~LogicalType((LogicalType *)local_148);
    goto LAB_011d974f;
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector(this_04);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)local_148);
LAB_011d974f:
  LogicalType::GetAlias_abi_cxx11_((string *)local_80,type);
  LogicalType::SetAlias((LogicalType *)&local_168,(string *)local_80);
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_);
  }
  bVar7 = LogicalType::HasExtensionInfo(type);
  if (bVar7) {
    local_1c0._0_8_ = LogicalType::GetExtensionInfo(type);
    optional_ptr<const_duckdb::ExtensionTypeInfo,_true>::CheckValid
              ((optional_ptr<const_duckdb::ExtensionTypeInfo,_true> *)local_1c0);
    uVar4 = local_1c0._0_8_;
    this_02 = (vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
              operator_new(0x50);
    std::vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>::vector
              (this_02,(vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                        *)uVar4);
    local_148._0_8_ = this_02 + 1;
    this_02[1].
    super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    this_02[1].
    super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)(((string *)(uVar4 + 0x20))->_M_dataplus)._M_p;
    this_02[1].
    super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_02[2].
    super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(uVar4 + 0x30))->_M_allocated_capacity;
    pLVar2 = *(pointer *)(uVar4 + 0x40);
    this_02[2].
    super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>.
    _M_impl.super__Vector_impl_data._M_finish = *(pointer *)(uVar4 + 0x38);
    this_02[2].
    super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = pLVar2;
    this_02[3].
    super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::Value>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)local_148._0_8_,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(uVar4 + 0x18),
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
                *)local_148);
  }
  else {
    this_02 = (vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
              0x0;
  }
  local_198._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_120._M_nxt = (_Hash_node_base *)this_02;
  LogicalType::SetExtensionInfo
            ((LogicalType *)&local_168,
             (unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
              *)&local_120);
  this_01._M_nxt = local_120._M_nxt;
  if ((vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
      local_120._M_nxt !=
      (vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_120._M_nxt + 3));
    std::vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>::~vector
              ((vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
               this_01._M_nxt);
    operator_delete(this_01._M_nxt);
  }
  local_120._M_nxt = (_Hash_node_base *)0x0;
  LogicalType::LogicalType(__return_storage_ptr__,(LogicalType *)&local_168);
  _Var5._M_pi = local_198._M_pi;
  if ((CatalogSet *)local_198._M_pi != (CatalogSet *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_198._M_pi[1]._M_use_count);
    std::vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>::~vector
              ((vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
               _Var5._M_pi);
    operator_delete(_Var5._M_pi);
  }
LAB_011d9899:
  LogicalType::~LogicalType((LogicalType *)&local_168);
  return __return_storage_ptr__;
}

Assistant:

LogicalType Binder::BindLogicalTypeInternal(const LogicalType &type, optional_ptr<Catalog> catalog,
                                            const string &schema) {
	if (type.id() != LogicalTypeId::USER) {
		// Nested type, make sure to bind any nested user types recursively
		LogicalType result;
		switch (type.id()) {
		case LogicalTypeId::LIST: {
			auto child_type = BindLogicalTypeInternal(ListType::GetChildType(type), catalog, schema);
			result = LogicalType::LIST(child_type);
			break;
		}
		case LogicalTypeId::MAP: {
			auto key_type = BindLogicalTypeInternal(MapType::KeyType(type), catalog, schema);
			auto value_type = BindLogicalTypeInternal(MapType::ValueType(type), catalog, schema);
			result = LogicalType::MAP(std::move(key_type), std::move(value_type));
			break;
		}
		case LogicalTypeId::ARRAY: {
			auto child_type = BindLogicalTypeInternal(ArrayType::GetChildType(type), catalog, schema);
			auto array_size = ArrayType::GetSize(type);
			result = LogicalType::ARRAY(child_type, array_size);
			break;
		}
		case LogicalTypeId::STRUCT: {
			auto child_types = StructType::GetChildTypes(type);
			child_list_t<LogicalType> new_child_types;
			for (auto &entry : child_types) {
				new_child_types.emplace_back(entry.first, BindLogicalTypeInternal(entry.second, catalog, schema));
			}
			result = LogicalType::STRUCT(std::move(new_child_types));
			break;
		}
		case LogicalTypeId::UNION: {
			child_list_t<LogicalType> member_types;
			for (idx_t i = 0; i < UnionType::GetMemberCount(type); i++) {
				auto child_type = BindLogicalTypeInternal(UnionType::GetMemberType(type, i), catalog, schema);
				member_types.emplace_back(UnionType::GetMemberName(type, i), std::move(child_type));
			}
			result = LogicalType::UNION(std::move(member_types));
			break;
		}
		default:
			return type;
		}

		// Set the alias and extension info back
		result.SetAlias(type.GetAlias());
		auto ext_info = type.HasExtensionInfo() ? make_uniq<ExtensionTypeInfo>(*type.GetExtensionInfo()) : nullptr;
		result.SetExtensionInfo(std::move(ext_info));
		return result;
	}

	// User type, bind the user type
	auto user_type_name = UserType::GetTypeName(type);
	auto user_type_schema = UserType::GetSchema(type);
	auto user_type_mods = UserType::GetTypeModifiers(type);

	bind_logical_type_function_t user_bind_modifiers_func = nullptr;

	LogicalType result;
	EntryLookupInfo type_lookup(CatalogType::TYPE_ENTRY, user_type_name);
	if (catalog) {
		// The search order is:
		// 1) In the explicitly set schema (my_schema.my_type)
		// 2) In the same schema as the table
		// 3) In the same catalog
		// 4) System catalog

		optional_ptr<CatalogEntry> entry = nullptr;
		if (!user_type_schema.empty()) {
			entry = entry_retriever.GetEntry(*catalog, user_type_schema, type_lookup, OnEntryNotFound::RETURN_NULL);
		}
		if (!IsValidUserType(entry)) {
			entry = entry_retriever.GetEntry(*catalog, schema, type_lookup, OnEntryNotFound::RETURN_NULL);
		}
		if (!IsValidUserType(entry)) {
			entry = entry_retriever.GetEntry(*catalog, INVALID_SCHEMA, type_lookup, OnEntryNotFound::RETURN_NULL);
		}
		if (!IsValidUserType(entry)) {
			entry = entry_retriever.GetEntry(INVALID_CATALOG, INVALID_SCHEMA, type_lookup,
			                                 OnEntryNotFound::THROW_EXCEPTION);
		}
		auto &type_entry = entry->Cast<TypeCatalogEntry>();
		result = type_entry.user_type;
		user_bind_modifiers_func = type_entry.bind_function;
	} else {
		string type_catalog = UserType::GetCatalog(type);
		string type_schema = UserType::GetSchema(type);

		BindSchemaOrCatalog(context, type_catalog, type_schema);
		auto entry = entry_retriever.GetEntry(type_catalog, type_schema, type_lookup);
		auto &type_entry = entry->Cast<TypeCatalogEntry>();
		result = type_entry.user_type;
		user_bind_modifiers_func = type_entry.bind_function;
	}

	// Now we bind the inner user type
	BindLogicalType(result, catalog, schema);

	// Apply the type modifiers (if any)
	if (user_bind_modifiers_func) {
		// If an explicit bind_modifiers function was provided, use that to construct the type

		BindLogicalTypeInput input {context, result, user_type_mods};
		result = user_bind_modifiers_func(input);
	} else {
		if (!user_type_mods.empty()) {
			throw BinderException("Type '%s' does not take any type modifiers", user_type_name);
		}
	}
	return result;
}